

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
count_freqs(uint32_t *ibuff,size_t isize,size_t *maxv)

{
  value_type vVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  uint *puVar6;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint32_t i_2;
  uint32_t i_1;
  size_t total;
  size_t j;
  size_type cur_size;
  uint32_t v;
  size_t i;
  uint32_t newmax;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *F;
  allocator_type *in_stack_ffffffffffffff68;
  value_type *in_stack_ffffffffffffff70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  uint local_70;
  uint local_6c;
  ulong local_68;
  size_type local_60;
  uint local_4c;
  ulong local_48;
  undefined4 local_2c;
  undefined1 local_25;
  uint local_24;
  ulong *local_20;
  ulong local_18;
  long local_10;
  
  local_24 = 0;
  local_25 = 0;
  local_2c = 0;
  this = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x17bace);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this,(size_type)in_RDI,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x17baf3);
  for (local_48 = 0; local_48 < local_18; local_48 = local_48 + 1) {
    local_4c = *(int *)(local_10 + local_48 * 4) + 1;
    uVar2 = (ulong)local_4c;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
    if (sVar3 <= uVar2) {
      local_60 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this,(size_type)in_RDI);
      while (sVar3 = local_60,
            sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this),
            sVar3 < sVar4) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,local_60)
        ;
        *pvVar5 = 0;
        local_60 = local_60 + 1;
      }
    }
    puVar6 = std::max<unsigned_int>(&local_24,&local_4c);
    local_24 = *puVar6;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (this,(ulong)local_4c);
    *pvVar5 = *pvVar5 + 1;
  }
  *local_20 = (ulong)local_24;
  local_68 = 0;
  for (local_6c = 1; local_6c <= local_24; local_6c = local_6c + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (this,(ulong)local_6c);
    local_68 = *pvVar5 + local_68;
  }
  while (0x20000000000 < local_68) {
    local_68 = 0;
    for (local_70 = 1; local_70 <= local_24; local_70 = local_70 + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this,(ulong)local_70);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this,(ulong)local_70);
      *pvVar5 = vVar1 + 1 >> 1;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this,(ulong)local_70);
      local_68 = *pvVar5 + local_68;
    }
  }
  return in_RDI;
}

Assistant:

std::vector<uint32_t> count_freqs(
    const uint32_t* ibuff, size_t isize, size_t* maxv)
{
    uint32_t newmax = 0;
    std::vector<uint32_t> F(1024, 0);
    for (size_t i = 0; i < isize; i++) {
        uint32_t v = ibuff[i] + 1;
        if (v >= F.size()) {
            auto cur_size = F.size();
            F.resize(v + 1);
            for (size_t j = cur_size; j < F.size(); j++)
                F[j] = 0;
        }
        newmax = std::max(newmax, v);
        F[v]++;
    }
    *maxv = newmax;
    size_t total = 0;
    for (uint32_t i = 1; i <= newmax; i++) {
        total += F[i];
    }

    /* now downsample the frequency array if required, to ensure that
       total size is less than 2^28
    */
    while (total > MINR) {
        total = 0;
        for (uint32_t i = 1; i <= newmax; i++) {
            F[i] = (F[i] + 1) >> 1;
            total += F[i];
        }
    }
    /* return the array that got constructed */
    return F;
}